

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTime.c
# Opt level: O1

float Map_TimeCutComputeArrival(Map_Node_t *pNode,Map_Cut_t *pCut,int fPhase,float tWorstLimit)

{
  Map_Time_t *pMVar1;
  float *pfVar2;
  uint uVar3;
  Map_Super_t *pMVar4;
  Map_Node_t *pMVar5;
  float *pfVar6;
  long lVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  
  pfVar6 = pNode->p->pNodeDelays;
  if (pfVar6 == (float *)0x0) {
    fVar9 = 0.0;
  }
  else {
    fVar9 = pfVar6[pNode->Num];
  }
  pMVar4 = pCut->M[fPhase].pSuperBest;
  uVar3 = pCut->M[fPhase].uPhaseBest;
  pCut->M[fPhase].tArrive.Rise = 0.0;
  pCut->M[fPhase].tArrive.Fall = 0.0;
  pCut->M[fPhase].tArrive.Worst = 3.4028235e+37;
  lVar7 = (long)pCut->nLeaves;
  if (0 < lVar7) {
    pfVar6 = &pMVar4->tDelaysR[lVar7 + 5].Fall;
    do {
      pMVar5 = pCut->ppLeaves[lVar7 + -1];
      bVar8 = (~uVar3 >> ((uint)(lVar7 + -1) & 0x1f) & 1) != 0;
      if (0.0 < pfVar6[-0x13]) {
        fVar10 = pfVar6[-0x13] + pMVar5->tArrival[bVar8].Rise + fVar9;
        if (tWorstLimit < fVar10) {
          return 3.4028235e+37;
        }
        pMVar1 = &pCut->M[fPhase].tArrive;
        if (pMVar1->Rise <= fVar10 && fVar10 != pMVar1->Rise) {
          pCut->M[fPhase].tArrive.Rise = fVar10;
        }
      }
      if (0.0 < pfVar6[-0x12]) {
        fVar10 = pfVar6[-0x12] + pMVar5->tArrival[bVar8].Fall + fVar9;
        if (tWorstLimit < fVar10) {
          return 3.4028235e+37;
        }
        pMVar1 = &pCut->M[fPhase].tArrive;
        if (pMVar1->Rise <= fVar10 && fVar10 != pMVar1->Rise) {
          pCut->M[fPhase].tArrive.Rise = fVar10;
        }
      }
      if (0.0 < ((Map_Time_t *)(pfVar6 + -1))->Rise) {
        fVar10 = ((Map_Time_t *)(pfVar6 + -1))->Rise + pMVar5->tArrival[bVar8].Rise + fVar9;
        if (tWorstLimit < fVar10) {
          return 3.4028235e+37;
        }
        pfVar2 = &pCut->M[fPhase].tArrive.Fall;
        if (*pfVar2 <= fVar10 && fVar10 != *pfVar2) {
          pCut->M[fPhase].tArrive.Fall = fVar10;
        }
      }
      if (0.0 < *pfVar6) {
        fVar10 = *pfVar6 + pMVar5->tArrival[bVar8].Fall + fVar9;
        if (tWorstLimit < fVar10) {
          return 3.4028235e+37;
        }
        pfVar2 = &pCut->M[fPhase].tArrive.Fall;
        if (*pfVar2 <= fVar10 && fVar10 != *pfVar2) {
          pCut->M[fPhase].tArrive.Fall = fVar10;
        }
      }
      pfVar6 = pfVar6 + -3;
      bVar8 = 1 < lVar7;
      lVar7 = lVar7 + -1;
    } while (bVar8);
  }
  fVar9 = pCut->M[fPhase].tArrive.Rise;
  fVar10 = pCut->M[fPhase].tArrive.Fall;
  if (fVar9 <= fVar10) {
    fVar9 = fVar10;
  }
  pCut->M[fPhase].tArrive.Worst = fVar9;
  return fVar9;
}

Assistant:

float Map_TimeCutComputeArrival( Map_Node_t * pNode, Map_Cut_t * pCut, int fPhase, float tWorstLimit )
{
    Map_Match_t * pM = pCut->M + fPhase;
    Map_Super_t * pSuper = pM->pSuperBest;
    unsigned uPhaseTot = pM->uPhaseBest;
    Map_Time_t * ptArrRes = &pM->tArrive;
    Map_Time_t * ptArrIn;
    int fPinPhase;
    float tDelay, tExtra;
    int i;

    tExtra = pNode->p->pNodeDelays ? pNode->p->pNodeDelays[pNode->Num] : 0;
    ptArrRes->Rise  = ptArrRes->Fall = 0.0;
    ptArrRes->Worst = MAP_FLOAT_LARGE;
    for ( i = pCut->nLeaves - 1; i >= 0; i-- )
    {
        // get the phase of the given pin
        fPinPhase = ((uPhaseTot & (1 << i)) == 0);
        ptArrIn = pCut->ppLeaves[i]->tArrival + fPinPhase;

        // get the rise of the output due to rise of the inputs
        if ( pSuper->tDelaysR[i].Rise > 0 )
        {
            tDelay = ptArrIn->Rise + pSuper->tDelaysR[i].Rise + tExtra;
            if ( tDelay > tWorstLimit )
                return MAP_FLOAT_LARGE;
            if ( ptArrRes->Rise < tDelay )
                ptArrRes->Rise = tDelay;
        }

        // get the rise of the output due to fall of the inputs
        if ( pSuper->tDelaysR[i].Fall > 0 )
        {
            tDelay = ptArrIn->Fall + pSuper->tDelaysR[i].Fall + tExtra;
            if ( tDelay > tWorstLimit )
                return MAP_FLOAT_LARGE;
            if ( ptArrRes->Rise < tDelay )
                ptArrRes->Rise = tDelay;
        }

        // get the fall of the output due to rise of the inputs
        if ( pSuper->tDelaysF[i].Rise > 0 )
        {
            tDelay = ptArrIn->Rise + pSuper->tDelaysF[i].Rise + tExtra;
            if ( tDelay > tWorstLimit )
                return MAP_FLOAT_LARGE;
            if ( ptArrRes->Fall < tDelay )
                ptArrRes->Fall = tDelay;
        }

        // get the fall of the output due to fall of the inputs
        if ( pSuper->tDelaysF[i].Fall > 0 )
        {
            tDelay = ptArrIn->Fall + pSuper->tDelaysF[i].Fall + tExtra;
            if ( tDelay > tWorstLimit )
                return MAP_FLOAT_LARGE;
            if ( ptArrRes->Fall < tDelay )
                ptArrRes->Fall = tDelay;
        }
    }
    // return the worst-case of rise/fall arrival times
    ptArrRes->Worst = MAP_MAX(ptArrRes->Rise, ptArrRes->Fall);
    return ptArrRes->Worst;
}